

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pShaderCompilationCases.cpp
# Opt level: O1

string * __thiscall
deqp::gles3::Performance::lightFragmentTemplate_abi_cxx11_
          (string *__return_storage_ptr__,Performance *this,int numLights,bool isVertexCase,
          LightType lightType)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long *plVar2;
  undefined8 *puVar3;
  undefined7 in_register_00000009;
  ulong *puVar4;
  size_type *psVar5;
  long *plVar6;
  ulong uVar7;
  undefined8 uVar8;
  _Alloc_hider _Var9;
  int iVar10;
  string ndxStr;
  ostringstream s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_508;
  ulong *local_4e8;
  long local_4e0;
  ulong local_4d8;
  long lStack_4d0;
  int local_4c4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4a0;
  ulong *local_480;
  long local_478;
  ulong local_470;
  long lStack_468;
  long *local_460;
  long local_458;
  long local_450;
  long lStack_448;
  int local_43c;
  long *local_438;
  long local_430;
  long local_428;
  long lStack_420;
  int local_414;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_410;
  long *local_3f0;
  long local_3e8;
  long local_3e0;
  long lStack_3d8;
  long *local_3d0;
  long local_3c8;
  long local_3c0;
  long lStack_3b8;
  long *local_3b0;
  long local_3a8;
  long local_3a0;
  long lStack_398;
  long *local_390;
  long local_388;
  long local_380;
  long lStack_378;
  long *local_370;
  long local_368;
  long local_360;
  long lStack_358;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_350;
  long *local_330;
  long local_328;
  long local_320;
  long lStack_318;
  long *local_310;
  long local_308;
  long local_300;
  long lStack_2f8;
  long *local_2f0;
  long local_2e8;
  long local_2e0;
  long lStack_2d8;
  long *local_2d0;
  long local_2c8;
  long local_2c0;
  long lStack_2b8;
  long *local_2b0;
  long local_2a8;
  long local_2a0;
  long lStack_298;
  long *local_290;
  long local_288;
  long local_280;
  long lStack_278;
  long *local_270;
  long local_268;
  long local_260;
  long lStack_258;
  long *local_250;
  long local_248;
  long local_240;
  long lStack_238;
  long *local_230;
  long local_228;
  long local_220;
  long lStack_218;
  long *local_210;
  long local_208;
  long local_200;
  long lStack_1f8;
  long *local_1f0;
  long local_1e8;
  long local_1e0;
  long lStack_1d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  long *local_1a8;
  long local_1a0;
  long local_198;
  long lStack_190;
  ios_base local_138 [264];
  
  local_43c = (int)CONCAT71(in_register_00000009,isVertexCase);
  local_4c4 = (int)this;
  local_1d0 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_1d0;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_414 = numLights;
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  if (((char)local_414 == '\0') &&
     (std::__cxx11::string::append((char *)__return_storage_ptr__), 0 < local_4c4)) {
    paVar1 = &local_4c0.field_2;
    iVar10 = 0;
    do {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
      std::ostream::operator<<((ostringstream *)&local_1a8,iVar10);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
      std::ios_base::~ios_base(local_138);
      std::operator+(&local_4a0,"uniform mediump vec3 u_light",&local_508);
      plVar2 = (long *)std::__cxx11::string::append((char *)&local_4a0);
      local_4e8 = &local_4d8;
      puVar4 = (ulong *)(plVar2 + 2);
      if ((ulong *)*plVar2 == puVar4) {
        local_4d8 = *puVar4;
        lStack_4d0 = plVar2[3];
      }
      else {
        local_4d8 = *puVar4;
        local_4e8 = (ulong *)*plVar2;
      }
      local_4e0 = plVar2[1];
      *plVar2 = (long)puVar4;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      puVar3 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_4e8,(ulong)local_508._M_dataplus._M_p)
      ;
      psVar5 = puVar3 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar3 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar5) {
        local_4c0.field_2._M_allocated_capacity = *psVar5;
        local_4c0.field_2._8_8_ = puVar3[3];
        local_4c0._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_4c0.field_2._M_allocated_capacity = *psVar5;
        local_4c0._M_dataplus._M_p = (pointer)*puVar3;
      }
      local_4c0._M_string_length = puVar3[1];
      *puVar3 = psVar5;
      puVar3[1] = 0;
      *(undefined1 *)(puVar3 + 2) = 0;
      plVar2 = (long *)std::__cxx11::string::append((char *)&local_4c0);
      plVar6 = plVar2 + 2;
      if ((long *)*plVar2 == plVar6) {
        local_198 = *plVar6;
        lStack_190 = plVar2[3];
        local_1a8 = &local_198;
      }
      else {
        local_198 = *plVar6;
        local_1a8 = (long *)*plVar2;
      }
      local_1a0 = plVar2[1];
      *plVar2 = (long)plVar6;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_1a8);
      if (local_1a8 != &local_198) {
        operator_delete(local_1a8,local_198 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4c0._M_dataplus._M_p != paVar1) {
        operator_delete(local_4c0._M_dataplus._M_p,local_4c0.field_2._M_allocated_capacity + 1);
      }
      if (local_4e8 != &local_4d8) {
        operator_delete(local_4e8,local_4d8 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4a0._M_dataplus._M_p != &local_4a0.field_2) {
        operator_delete(local_4a0._M_dataplus._M_p,local_4a0.field_2._M_allocated_capacity + 1);
      }
      if (local_43c == 1) {
        std::operator+(&local_410,"uniform mediump vec4 u_light",&local_508);
        plVar2 = (long *)std::__cxx11::string::append((char *)&local_410);
        local_438 = &local_428;
        plVar6 = plVar2 + 2;
        if ((long *)*plVar2 == plVar6) {
          local_428 = *plVar6;
          lStack_420 = plVar2[3];
        }
        else {
          local_428 = *plVar6;
          local_438 = (long *)*plVar2;
        }
        local_430 = plVar2[1];
        *plVar2 = (long)plVar6;
        plVar2[1] = 0;
        *(undefined1 *)(plVar2 + 2) = 0;
        plVar2 = (long *)std::__cxx11::string::_M_append
                                   ((char *)&local_438,(ulong)local_508._M_dataplus._M_p);
        local_480 = &local_470;
        puVar4 = (ulong *)(plVar2 + 2);
        if ((ulong *)*plVar2 == puVar4) {
          local_470 = *puVar4;
          lStack_468 = plVar2[3];
        }
        else {
          local_470 = *puVar4;
          local_480 = (ulong *)*plVar2;
        }
        local_478 = plVar2[1];
        *plVar2 = (long)puVar4;
        plVar2[1] = 0;
        *(undefined1 *)(plVar2 + 2) = 0;
        plVar2 = (long *)std::__cxx11::string::append((char *)&local_480);
        local_460 = &local_450;
        plVar6 = plVar2 + 2;
        if ((long *)*plVar2 == plVar6) {
          local_450 = *plVar6;
          lStack_448 = plVar2[3];
        }
        else {
          local_450 = *plVar6;
          local_460 = (long *)*plVar2;
        }
        local_458 = plVar2[1];
        *plVar2 = (long)plVar6;
        plVar2[1] = 0;
        *(undefined1 *)(plVar2 + 2) = 0;
        plVar2 = (long *)std::__cxx11::string::_M_append
                                   ((char *)&local_460,(ulong)local_508._M_dataplus._M_p);
        local_4a0._M_dataplus._M_p = (pointer)&local_4a0.field_2;
        psVar5 = (size_type *)(plVar2 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar2 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar5) {
          local_4a0.field_2._M_allocated_capacity = *psVar5;
          local_4a0.field_2._8_8_ = plVar2[3];
        }
        else {
          local_4a0.field_2._M_allocated_capacity = *psVar5;
          local_4a0._M_dataplus._M_p = (pointer)*plVar2;
        }
        local_4a0._M_string_length = plVar2[1];
        *plVar2 = (long)psVar5;
        plVar2[1] = 0;
        *(undefined1 *)(plVar2 + 2) = 0;
        plVar2 = (long *)std::__cxx11::string::append((char *)&local_4a0);
        local_4e8 = &local_4d8;
        puVar4 = (ulong *)(plVar2 + 2);
        if ((ulong *)*plVar2 == puVar4) {
          local_4d8 = *puVar4;
          lStack_4d0 = plVar2[3];
        }
        else {
          local_4d8 = *puVar4;
          local_4e8 = (ulong *)*plVar2;
        }
        local_4e0 = plVar2[1];
        *plVar2 = (long)puVar4;
        plVar2[1] = 0;
        *(undefined1 *)(plVar2 + 2) = 0;
        puVar3 = (undefined8 *)
                 std::__cxx11::string::_M_append
                           ((char *)&local_4e8,(ulong)local_508._M_dataplus._M_p);
        psVar5 = puVar3 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar3 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar5) {
          local_4c0.field_2._M_allocated_capacity = *psVar5;
          local_4c0.field_2._8_8_ = puVar3[3];
          local_4c0._M_dataplus._M_p = (pointer)paVar1;
        }
        else {
          local_4c0.field_2._M_allocated_capacity = *psVar5;
          local_4c0._M_dataplus._M_p = (pointer)*puVar3;
        }
        local_4c0._M_string_length = puVar3[1];
        *puVar3 = psVar5;
        puVar3[1] = 0;
        *(undefined1 *)(puVar3 + 2) = 0;
        plVar2 = (long *)std::__cxx11::string::append((char *)&local_4c0);
        plVar6 = plVar2 + 2;
        if ((long *)*plVar2 == plVar6) {
          local_198 = *plVar6;
          lStack_190 = plVar2[3];
          local_1a8 = &local_198;
        }
        else {
          local_198 = *plVar6;
          local_1a8 = (long *)*plVar2;
        }
        local_1a0 = plVar2[1];
        *plVar2 = (long)plVar6;
        plVar2[1] = 0;
        *(undefined1 *)(plVar2 + 2) = 0;
        std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_1a8);
        if (local_1a8 != &local_198) {
          operator_delete(local_1a8,local_198 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4c0._M_dataplus._M_p != paVar1) {
          operator_delete(local_4c0._M_dataplus._M_p,local_4c0.field_2._M_allocated_capacity + 1);
        }
        if (local_4e8 != &local_4d8) {
          operator_delete(local_4e8,local_4d8 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4a0._M_dataplus._M_p != &local_4a0.field_2) {
          operator_delete(local_4a0._M_dataplus._M_p,local_4a0.field_2._M_allocated_capacity + 1);
        }
        if (local_460 != &local_450) {
          operator_delete(local_460,local_450 + 1);
        }
        if (local_480 != &local_470) {
          operator_delete(local_480,local_470 + 1);
        }
        if (local_438 != &local_428) {
          operator_delete(local_438,local_428 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_410._M_dataplus._M_p != &local_410.field_2) {
          operator_delete(local_410._M_dataplus._M_p,local_410.field_2._M_allocated_capacity + 1);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_508._M_dataplus._M_p != &local_508.field_2) {
        operator_delete(local_508._M_dataplus._M_p,local_508.field_2._M_allocated_capacity + 1);
      }
      iVar10 = iVar10 + 1;
    } while (local_4c4 != iVar10);
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  if ((char)local_414 != '\0') goto LAB_006eefe6;
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  if (local_43c == 1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
    std::ostream::operator<<(&local_1a8,local_4c4);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
    std::ios_base::~ios_base(local_138);
    plVar2 = (long *)std::__cxx11::string::replace((ulong)&local_460,0,(char *)0x0,0xb54e09);
    psVar5 = (size_type *)(plVar2 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar2 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar5) {
      local_4a0.field_2._M_allocated_capacity = *psVar5;
      local_4a0.field_2._8_8_ = plVar2[3];
      local_4a0._M_dataplus._M_p = (pointer)&local_4a0.field_2;
    }
    else {
      local_4a0.field_2._M_allocated_capacity = *psVar5;
      local_4a0._M_dataplus._M_p = (pointer)*plVar2;
    }
    local_4a0._M_string_length = plVar2[1];
    *plVar2 = (long)psVar5;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    plVar2 = (long *)std::__cxx11::string::append((char *)&local_4a0);
    puVar4 = (ulong *)(plVar2 + 2);
    if ((ulong *)*plVar2 == puVar4) {
      local_4d8 = *puVar4;
      lStack_4d0 = plVar2[3];
      local_4e8 = &local_4d8;
    }
    else {
      local_4d8 = *puVar4;
      local_4e8 = (ulong *)*plVar2;
    }
    local_4e0 = plVar2[1];
    *plVar2 = (long)puVar4;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
    std::ostream::operator<<(&local_1a8,local_4c4);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
    std::ios_base::~ios_base(local_138);
    uVar7 = 0xf;
    if (local_4e8 != &local_4d8) {
      uVar7 = local_4d8;
    }
    if (uVar7 < (ulong)(local_478 + local_4e0)) {
      uVar7 = 0xf;
      if (local_480 != &local_470) {
        uVar7 = local_470;
      }
      if (uVar7 < (ulong)(local_478 + local_4e0)) goto LAB_006eee2b;
      puVar3 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_480,0,(char *)0x0,(ulong)local_4e8);
    }
    else {
LAB_006eee2b:
      puVar3 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_4e8,(ulong)local_480);
    }
    local_4c0._M_dataplus._M_p = (pointer)&local_4c0.field_2;
    psVar5 = puVar3 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar3 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar5) {
      local_4c0.field_2._M_allocated_capacity = *psVar5;
      local_4c0.field_2._8_8_ = puVar3[3];
    }
    else {
      local_4c0.field_2._M_allocated_capacity = *psVar5;
      local_4c0._M_dataplus._M_p = (pointer)*puVar3;
    }
    local_4c0._M_string_length = puVar3[1];
    *puVar3 = psVar5;
    puVar3[1] = 0;
    *(undefined1 *)psVar5 = 0;
    plVar2 = (long *)std::__cxx11::string::append((char *)&local_4c0);
    psVar5 = (size_type *)(plVar2 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar2 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar5) {
      local_508.field_2._M_allocated_capacity = *psVar5;
      local_508.field_2._8_8_ = plVar2[3];
      local_508._M_dataplus._M_p = (pointer)&local_508.field_2;
    }
    else {
      local_508.field_2._M_allocated_capacity = *psVar5;
      local_508._M_dataplus._M_p = (pointer)*plVar2;
    }
    local_508._M_string_length = plVar2[1];
    *plVar2 = (long)psVar5;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    std::__cxx11::string::_M_append
              ((char *)__return_storage_ptr__,(ulong)local_508._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_508._M_dataplus._M_p != &local_508.field_2) {
      operator_delete(local_508._M_dataplus._M_p,local_508.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4c0._M_dataplus._M_p != &local_4c0.field_2) {
      operator_delete(local_4c0._M_dataplus._M_p,local_4c0.field_2._M_allocated_capacity + 1);
    }
    if (local_480 != &local_470) {
      operator_delete(local_480,local_470 + 1);
    }
    if (local_4e8 != &local_4d8) {
      operator_delete(local_4e8,local_4d8 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4a0._M_dataplus._M_p != &local_4a0.field_2) {
      operator_delete(local_4a0._M_dataplus._M_p,local_4a0.field_2._M_allocated_capacity + 1);
    }
    if (local_460 != &local_450) {
      operator_delete(local_460,local_450 + 1);
    }
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  if (local_43c == 1) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
LAB_006eefe6:
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  if (((char)local_414 == '\0') &&
     (std::__cxx11::string::append((char *)__return_storage_ptr__), 0 < local_4c4)) {
    paVar1 = &local_4c0.field_2;
    iVar10 = 0;
    do {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
      std::ostream::operator<<((ostringstream *)&local_1a8,iVar10);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
      std::ios_base::~ios_base(local_138);
      std::operator+(&local_4c0,"\t/* Light ",&local_508);
      plVar2 = (long *)std::__cxx11::string::append((char *)&local_4c0);
      plVar6 = plVar2 + 2;
      if ((long *)*plVar2 == plVar6) {
        local_198 = *plVar6;
        lStack_190 = plVar2[3];
        local_1a8 = &local_198;
      }
      else {
        local_198 = *plVar6;
        local_1a8 = (long *)*plVar2;
      }
      local_1a0 = plVar2[1];
      *plVar2 = (long)plVar6;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_1a8);
      if (local_1a8 != &local_198) {
        operator_delete(local_1a8,local_198 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4c0._M_dataplus._M_p != paVar1) {
        operator_delete(local_4c0._M_dataplus._M_p,local_4c0.field_2._M_allocated_capacity + 1);
      }
      if (local_43c == 0) {
        std::operator+(&local_350,"\tmediump vec3 directionToLight",&local_508);
        plVar2 = (long *)std::__cxx11::string::append((char *)&local_350);
        local_3f0 = &local_3e0;
        plVar6 = plVar2 + 2;
        if ((long *)*plVar2 == plVar6) {
          local_3e0 = *plVar6;
          lStack_3d8 = plVar2[3];
        }
        else {
          local_3e0 = *plVar6;
          local_3f0 = (long *)*plVar2;
        }
        local_3e8 = plVar2[1];
        *plVar2 = (long)plVar6;
        plVar2[1] = 0;
        *(undefined1 *)(plVar2 + 2) = 0;
        plVar2 = (long *)std::__cxx11::string::_M_append
                                   ((char *)&local_3f0,(ulong)local_508._M_dataplus._M_p);
        local_3d0 = &local_3c0;
        plVar6 = plVar2 + 2;
        if ((long *)*plVar2 == plVar6) {
          local_3c0 = *plVar6;
          lStack_3b8 = plVar2[3];
        }
        else {
          local_3c0 = *plVar6;
          local_3d0 = (long *)*plVar2;
        }
        local_3c8 = plVar2[1];
        *plVar2 = (long)plVar6;
        plVar2[1] = 0;
        *(undefined1 *)(plVar2 + 2) = 0;
        plVar2 = (long *)std::__cxx11::string::append((char *)&local_3d0);
        local_3b0 = &local_3a0;
        plVar6 = plVar2 + 2;
        if ((long *)*plVar2 == plVar6) {
          local_3a0 = *plVar6;
          lStack_398 = plVar2[3];
        }
        else {
          local_3a0 = *plVar6;
          local_3b0 = (long *)*plVar2;
        }
        local_3a8 = plVar2[1];
        *plVar2 = (long)plVar6;
        plVar2[1] = 0;
        *(undefined1 *)(plVar2 + 2) = 0;
        plVar2 = (long *)std::__cxx11::string::_M_append
                                   ((char *)&local_3b0,(ulong)local_508._M_dataplus._M_p);
        local_390 = &local_380;
        plVar6 = plVar2 + 2;
        if ((long *)*plVar2 == plVar6) {
          local_380 = *plVar6;
          lStack_378 = plVar2[3];
        }
        else {
          local_380 = *plVar6;
          local_390 = (long *)*plVar2;
        }
        local_388 = plVar2[1];
        *plVar2 = (long)plVar6;
        plVar2[1] = 0;
        *(undefined1 *)(plVar2 + 2) = 0;
        plVar2 = (long *)std::__cxx11::string::append((char *)&local_390);
        local_370 = &local_360;
        plVar6 = plVar2 + 2;
        if ((long *)*plVar2 == plVar6) {
          local_360 = *plVar6;
          lStack_358 = plVar2[3];
        }
        else {
          local_360 = *plVar6;
          local_370 = (long *)*plVar2;
        }
        local_368 = plVar2[1];
        *plVar2 = (long)plVar6;
        plVar2[1] = 0;
        *(undefined1 *)(plVar2 + 2) = 0;
        plVar2 = (long *)std::__cxx11::string::_M_append
                                   ((char *)&local_370,(ulong)local_508._M_dataplus._M_p);
        local_410._M_dataplus._M_p = (pointer)&local_410.field_2;
        psVar5 = (size_type *)(plVar2 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar2 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar5) {
          local_410.field_2._M_allocated_capacity = *psVar5;
          local_410.field_2._8_8_ = plVar2[3];
        }
        else {
          local_410.field_2._M_allocated_capacity = *psVar5;
          local_410._M_dataplus._M_p = (pointer)*plVar2;
        }
        local_410._M_string_length = plVar2[1];
        *plVar2 = (long)psVar5;
        plVar2[1] = 0;
        *(undefined1 *)(plVar2 + 2) = 0;
        plVar2 = (long *)std::__cxx11::string::append((char *)&local_410);
        local_438 = &local_428;
        plVar6 = plVar2 + 2;
        if ((long *)*plVar2 == plVar6) {
          local_428 = *plVar6;
          lStack_420 = plVar2[3];
        }
        else {
          local_428 = *plVar6;
          local_438 = (long *)*plVar2;
        }
        local_430 = plVar2[1];
        *plVar2 = (long)plVar6;
        plVar2[1] = 0;
        *(undefined1 *)(plVar2 + 2) = 0;
        plVar2 = (long *)std::__cxx11::string::_M_append
                                   ((char *)&local_438,(ulong)local_508._M_dataplus._M_p);
        local_480 = &local_470;
        puVar4 = (ulong *)(plVar2 + 2);
        if ((ulong *)*plVar2 == puVar4) {
          local_470 = *puVar4;
          lStack_468 = plVar2[3];
        }
        else {
          local_470 = *puVar4;
          local_480 = (ulong *)*plVar2;
        }
        local_478 = plVar2[1];
        *plVar2 = (long)puVar4;
        plVar2[1] = 0;
        *(undefined1 *)(plVar2 + 2) = 0;
        plVar2 = (long *)std::__cxx11::string::append((char *)&local_480);
        local_460 = &local_450;
        plVar6 = plVar2 + 2;
        if ((long *)*plVar2 == plVar6) {
          local_450 = *plVar6;
          lStack_448 = plVar2[3];
        }
        else {
          local_450 = *plVar6;
          local_460 = (long *)*plVar2;
        }
        local_458 = plVar2[1];
        *plVar2 = (long)plVar6;
        plVar2[1] = 0;
        *(undefined1 *)(plVar2 + 2) = 0;
        plVar2 = (long *)std::__cxx11::string::_M_append
                                   ((char *)&local_460,(ulong)local_508._M_dataplus._M_p);
        local_4a0._M_dataplus._M_p = (pointer)&local_4a0.field_2;
        psVar5 = (size_type *)(plVar2 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar2 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar5) {
          local_4a0.field_2._M_allocated_capacity = *psVar5;
          local_4a0.field_2._8_8_ = plVar2[3];
        }
        else {
          local_4a0.field_2._M_allocated_capacity = *psVar5;
          local_4a0._M_dataplus._M_p = (pointer)*plVar2;
        }
        local_4a0._M_string_length = plVar2[1];
        *plVar2 = (long)psVar5;
        plVar2[1] = 0;
        *(undefined1 *)(plVar2 + 2) = 0;
        plVar2 = (long *)std::__cxx11::string::append((char *)&local_4a0);
        local_4e8 = &local_4d8;
        puVar4 = (ulong *)(plVar2 + 2);
        if ((ulong *)*plVar2 == puVar4) {
          local_4d8 = *puVar4;
          lStack_4d0 = plVar2[3];
        }
        else {
          local_4d8 = *puVar4;
          local_4e8 = (ulong *)*plVar2;
        }
        local_4e0 = plVar2[1];
        *plVar2 = (long)puVar4;
        plVar2[1] = 0;
        *(undefined1 *)(plVar2 + 2) = 0;
        puVar3 = (undefined8 *)
                 std::__cxx11::string::_M_append
                           ((char *)&local_4e8,(ulong)local_508._M_dataplus._M_p);
        psVar5 = puVar3 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar3 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar5) {
          local_4c0.field_2._M_allocated_capacity = *psVar5;
          local_4c0.field_2._8_8_ = puVar3[3];
          local_4c0._M_dataplus._M_p = (pointer)paVar1;
        }
        else {
          local_4c0.field_2._M_allocated_capacity = *psVar5;
          local_4c0._M_dataplus._M_p = (pointer)*puVar3;
        }
        local_4c0._M_string_length = puVar3[1];
        *puVar3 = psVar5;
        puVar3[1] = 0;
        *(undefined1 *)(puVar3 + 2) = 0;
        plVar2 = (long *)std::__cxx11::string::append((char *)&local_4c0);
        plVar6 = plVar2 + 2;
        if ((long *)*plVar2 == plVar6) {
          local_198 = *plVar6;
          lStack_190 = plVar2[3];
          local_1a8 = &local_198;
        }
        else {
          local_198 = *plVar6;
          local_1a8 = (long *)*plVar2;
        }
        local_1a0 = plVar2[1];
        *plVar2 = (long)plVar6;
        plVar2[1] = 0;
        *(undefined1 *)(plVar2 + 2) = 0;
        std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_1a8);
        if (local_1a8 != &local_198) {
          operator_delete(local_1a8,local_198 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4c0._M_dataplus._M_p != paVar1) {
          operator_delete(local_4c0._M_dataplus._M_p,local_4c0.field_2._M_allocated_capacity + 1);
        }
        if (local_4e8 != &local_4d8) {
          operator_delete(local_4e8,local_4d8 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4a0._M_dataplus._M_p != &local_4a0.field_2) {
          operator_delete(local_4a0._M_dataplus._M_p,local_4a0.field_2._M_allocated_capacity + 1);
        }
        if (local_460 != &local_450) {
          operator_delete(local_460,local_450 + 1);
        }
        if (local_480 != &local_470) {
          operator_delete(local_480,local_470 + 1);
        }
        if (local_438 != &local_428) {
          operator_delete(local_438,local_428 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_410._M_dataplus._M_p != &local_410.field_2) {
          operator_delete(local_410._M_dataplus._M_p,local_410.field_2._M_allocated_capacity + 1);
        }
        if (local_370 != &local_360) {
          operator_delete(local_370,local_360 + 1);
        }
        if (local_390 != &local_380) {
          operator_delete(local_390,local_380 + 1);
        }
        if (local_3b0 != &local_3a0) {
          operator_delete(local_3b0,local_3a0 + 1);
        }
        if (local_3d0 != &local_3c0) {
          operator_delete(local_3d0,local_3c0 + 1);
        }
        if (local_3f0 != &local_3e0) {
          operator_delete(local_3f0,local_3e0 + 1);
        }
        uVar8 = local_350.field_2._M_allocated_capacity;
        _Var9._M_p = local_350._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_350._M_dataplus._M_p != &local_350.field_2) {
LAB_006f06d9:
          operator_delete(_Var9._M_p,uVar8 + 1);
        }
      }
      else if (local_43c == 1) {
        std::operator+(&local_1c8,"\tmediump vec3 directionToLight",&local_508);
        plVar2 = (long *)std::__cxx11::string::append((char *)&local_1c8);
        local_330 = &local_320;
        plVar6 = plVar2 + 2;
        if ((long *)*plVar2 == plVar6) {
          local_320 = *plVar6;
          lStack_318 = plVar2[3];
        }
        else {
          local_320 = *plVar6;
          local_330 = (long *)*plVar2;
        }
        local_328 = plVar2[1];
        *plVar2 = (long)plVar6;
        plVar2[1] = 0;
        *(undefined1 *)(plVar2 + 2) = 0;
        plVar2 = (long *)std::__cxx11::string::_M_append
                                   ((char *)&local_330,(ulong)local_508._M_dataplus._M_p);
        local_310 = &local_300;
        plVar6 = plVar2 + 2;
        if ((long *)*plVar2 == plVar6) {
          local_300 = *plVar6;
          lStack_2f8 = plVar2[3];
        }
        else {
          local_300 = *plVar6;
          local_310 = (long *)*plVar2;
        }
        local_308 = plVar2[1];
        *plVar2 = (long)plVar6;
        plVar2[1] = 0;
        *(undefined1 *)(plVar2 + 2) = 0;
        plVar2 = (long *)std::__cxx11::string::append((char *)&local_310);
        local_2f0 = &local_2e0;
        plVar6 = plVar2 + 2;
        if ((long *)*plVar2 == plVar6) {
          local_2e0 = *plVar6;
          lStack_2d8 = plVar2[3];
        }
        else {
          local_2e0 = *plVar6;
          local_2f0 = (long *)*plVar2;
        }
        local_2e8 = plVar2[1];
        *plVar2 = (long)plVar6;
        plVar2[1] = 0;
        *(undefined1 *)(plVar2 + 2) = 0;
        plVar2 = (long *)std::__cxx11::string::_M_append
                                   ((char *)&local_2f0,(ulong)local_508._M_dataplus._M_p);
        local_2d0 = &local_2c0;
        plVar6 = plVar2 + 2;
        if ((long *)*plVar2 == plVar6) {
          local_2c0 = *plVar6;
          lStack_2b8 = plVar2[3];
        }
        else {
          local_2c0 = *plVar6;
          local_2d0 = (long *)*plVar2;
        }
        local_2c8 = plVar2[1];
        *plVar2 = (long)plVar6;
        plVar2[1] = 0;
        *(undefined1 *)(plVar2 + 2) = 0;
        plVar2 = (long *)std::__cxx11::string::append((char *)&local_2d0);
        local_2b0 = &local_2a0;
        plVar6 = plVar2 + 2;
        if ((long *)*plVar2 == plVar6) {
          local_2a0 = *plVar6;
          lStack_298 = plVar2[3];
        }
        else {
          local_2a0 = *plVar6;
          local_2b0 = (long *)*plVar2;
        }
        local_2a8 = plVar2[1];
        *plVar2 = (long)plVar6;
        plVar2[1] = 0;
        *(undefined1 *)(plVar2 + 2) = 0;
        plVar2 = (long *)std::__cxx11::string::_M_append
                                   ((char *)&local_2b0,(ulong)local_508._M_dataplus._M_p);
        local_290 = &local_280;
        plVar6 = plVar2 + 2;
        if ((long *)*plVar2 == plVar6) {
          local_280 = *plVar6;
          lStack_278 = plVar2[3];
        }
        else {
          local_280 = *plVar6;
          local_290 = (long *)*plVar2;
        }
        local_288 = plVar2[1];
        *plVar2 = (long)plVar6;
        plVar2[1] = 0;
        *(undefined1 *)(plVar2 + 2) = 0;
        plVar2 = (long *)std::__cxx11::string::append((char *)&local_290);
        local_270 = &local_260;
        plVar6 = plVar2 + 2;
        if ((long *)*plVar2 == plVar6) {
          local_260 = *plVar6;
          lStack_258 = plVar2[3];
        }
        else {
          local_260 = *plVar6;
          local_270 = (long *)*plVar2;
        }
        local_268 = plVar2[1];
        *plVar2 = (long)plVar6;
        plVar2[1] = 0;
        *(undefined1 *)(plVar2 + 2) = 0;
        plVar2 = (long *)std::__cxx11::string::_M_append
                                   ((char *)&local_270,(ulong)local_508._M_dataplus._M_p);
        local_250 = &local_240;
        plVar6 = plVar2 + 2;
        if ((long *)*plVar2 == plVar6) {
          local_240 = *plVar6;
          lStack_238 = plVar2[3];
        }
        else {
          local_240 = *plVar6;
          local_250 = (long *)*plVar2;
        }
        local_248 = plVar2[1];
        *plVar2 = (long)plVar6;
        plVar2[1] = 0;
        *(undefined1 *)(plVar2 + 2) = 0;
        plVar2 = (long *)std::__cxx11::string::append((char *)&local_250);
        local_230 = &local_220;
        plVar6 = plVar2 + 2;
        if ((long *)*plVar2 == plVar6) {
          local_220 = *plVar6;
          lStack_218 = plVar2[3];
        }
        else {
          local_220 = *plVar6;
          local_230 = (long *)*plVar2;
        }
        local_228 = plVar2[1];
        *plVar2 = (long)plVar6;
        plVar2[1] = 0;
        *(undefined1 *)(plVar2 + 2) = 0;
        plVar2 = (long *)std::__cxx11::string::_M_append
                                   ((char *)&local_230,(ulong)local_508._M_dataplus._M_p);
        local_210 = &local_200;
        plVar6 = plVar2 + 2;
        if ((long *)*plVar2 == plVar6) {
          local_200 = *plVar6;
          lStack_1f8 = plVar2[3];
        }
        else {
          local_200 = *plVar6;
          local_210 = (long *)*plVar2;
        }
        local_208 = plVar2[1];
        *plVar2 = (long)plVar6;
        plVar2[1] = 0;
        *(undefined1 *)(plVar2 + 2) = 0;
        plVar2 = (long *)std::__cxx11::string::append((char *)&local_210);
        local_1f0 = &local_1e0;
        plVar6 = plVar2 + 2;
        if ((long *)*plVar2 == plVar6) {
          local_1e0 = *plVar6;
          lStack_1d8 = plVar2[3];
        }
        else {
          local_1e0 = *plVar6;
          local_1f0 = (long *)*plVar2;
        }
        local_1e8 = plVar2[1];
        *plVar2 = (long)plVar6;
        plVar2[1] = 0;
        *(undefined1 *)(plVar2 + 2) = 0;
        plVar2 = (long *)std::__cxx11::string::_M_append
                                   ((char *)&local_1f0,(ulong)local_508._M_dataplus._M_p);
        local_350._M_dataplus._M_p = (pointer)&local_350.field_2;
        psVar5 = (size_type *)(plVar2 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar2 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar5) {
          local_350.field_2._M_allocated_capacity = *psVar5;
          local_350.field_2._8_8_ = plVar2[3];
        }
        else {
          local_350.field_2._M_allocated_capacity = *psVar5;
          local_350._M_dataplus._M_p = (pointer)*plVar2;
        }
        local_350._M_string_length = plVar2[1];
        *plVar2 = (long)psVar5;
        plVar2[1] = 0;
        *(undefined1 *)(plVar2 + 2) = 0;
        plVar2 = (long *)std::__cxx11::string::append((char *)&local_350);
        local_3f0 = &local_3e0;
        plVar6 = plVar2 + 2;
        if ((long *)*plVar2 == plVar6) {
          local_3e0 = *plVar6;
          lStack_3d8 = plVar2[3];
        }
        else {
          local_3e0 = *plVar6;
          local_3f0 = (long *)*plVar2;
        }
        local_3e8 = plVar2[1];
        *plVar2 = (long)plVar6;
        plVar2[1] = 0;
        *(undefined1 *)(plVar2 + 2) = 0;
        plVar2 = (long *)std::__cxx11::string::_M_append
                                   ((char *)&local_3f0,(ulong)local_508._M_dataplus._M_p);
        local_3d0 = &local_3c0;
        plVar6 = plVar2 + 2;
        if ((long *)*plVar2 == plVar6) {
          local_3c0 = *plVar6;
          lStack_3b8 = plVar2[3];
        }
        else {
          local_3c0 = *plVar6;
          local_3d0 = (long *)*plVar2;
        }
        local_3c8 = plVar2[1];
        *plVar2 = (long)plVar6;
        plVar2[1] = 0;
        *(undefined1 *)(plVar2 + 2) = 0;
        plVar2 = (long *)std::__cxx11::string::append((char *)&local_3d0);
        local_3b0 = &local_3a0;
        plVar6 = plVar2 + 2;
        if ((long *)*plVar2 == plVar6) {
          local_3a0 = *plVar6;
          lStack_398 = plVar2[3];
        }
        else {
          local_3a0 = *plVar6;
          local_3b0 = (long *)*plVar2;
        }
        local_3a8 = plVar2[1];
        *plVar2 = (long)plVar6;
        plVar2[1] = 0;
        *(undefined1 *)(plVar2 + 2) = 0;
        plVar2 = (long *)std::__cxx11::string::_M_append
                                   ((char *)&local_3b0,(ulong)local_508._M_dataplus._M_p);
        local_390 = &local_380;
        plVar6 = plVar2 + 2;
        if ((long *)*plVar2 == plVar6) {
          local_380 = *plVar6;
          lStack_378 = plVar2[3];
        }
        else {
          local_380 = *plVar6;
          local_390 = (long *)*plVar2;
        }
        local_388 = plVar2[1];
        *plVar2 = (long)plVar6;
        plVar2[1] = 0;
        *(undefined1 *)(plVar2 + 2) = 0;
        plVar2 = (long *)std::__cxx11::string::append((char *)&local_390);
        local_370 = &local_360;
        plVar6 = plVar2 + 2;
        if ((long *)*plVar2 == plVar6) {
          local_360 = *plVar6;
          lStack_358 = plVar2[3];
        }
        else {
          local_360 = *plVar6;
          local_370 = (long *)*plVar2;
        }
        local_368 = plVar2[1];
        *plVar2 = (long)plVar6;
        plVar2[1] = 0;
        *(undefined1 *)(plVar2 + 2) = 0;
        plVar2 = (long *)std::__cxx11::string::_M_append
                                   ((char *)&local_370,(ulong)local_508._M_dataplus._M_p);
        local_410._M_dataplus._M_p = (pointer)&local_410.field_2;
        psVar5 = (size_type *)(plVar2 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar2 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar5) {
          local_410.field_2._M_allocated_capacity = *psVar5;
          local_410.field_2._8_8_ = plVar2[3];
        }
        else {
          local_410.field_2._M_allocated_capacity = *psVar5;
          local_410._M_dataplus._M_p = (pointer)*plVar2;
        }
        local_410._M_string_length = plVar2[1];
        *plVar2 = (long)psVar5;
        plVar2[1] = 0;
        *(undefined1 *)(plVar2 + 2) = 0;
        plVar2 = (long *)std::__cxx11::string::append((char *)&local_410);
        local_438 = &local_428;
        plVar6 = plVar2 + 2;
        if ((long *)*plVar2 == plVar6) {
          local_428 = *plVar6;
          lStack_420 = plVar2[3];
        }
        else {
          local_428 = *plVar6;
          local_438 = (long *)*plVar2;
        }
        local_430 = plVar2[1];
        *plVar2 = (long)plVar6;
        plVar2[1] = 0;
        *(undefined1 *)(plVar2 + 2) = 0;
        plVar2 = (long *)std::__cxx11::string::_M_append
                                   ((char *)&local_438,(ulong)local_508._M_dataplus._M_p);
        local_480 = &local_470;
        puVar4 = (ulong *)(plVar2 + 2);
        if ((ulong *)*plVar2 == puVar4) {
          local_470 = *puVar4;
          lStack_468 = plVar2[3];
        }
        else {
          local_470 = *puVar4;
          local_480 = (ulong *)*plVar2;
        }
        local_478 = plVar2[1];
        *plVar2 = (long)puVar4;
        plVar2[1] = 0;
        *(undefined1 *)(plVar2 + 2) = 0;
        plVar2 = (long *)std::__cxx11::string::append((char *)&local_480);
        local_460 = &local_450;
        plVar6 = plVar2 + 2;
        if ((long *)*plVar2 == plVar6) {
          local_450 = *plVar6;
          lStack_448 = plVar2[3];
        }
        else {
          local_450 = *plVar6;
          local_460 = (long *)*plVar2;
        }
        local_458 = plVar2[1];
        *plVar2 = (long)plVar6;
        plVar2[1] = 0;
        *(undefined1 *)(plVar2 + 2) = 0;
        plVar2 = (long *)std::__cxx11::string::_M_append
                                   ((char *)&local_460,(ulong)local_508._M_dataplus._M_p);
        local_4a0._M_dataplus._M_p = (pointer)&local_4a0.field_2;
        psVar5 = (size_type *)(plVar2 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar2 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar5) {
          local_4a0.field_2._M_allocated_capacity = *psVar5;
          local_4a0.field_2._8_8_ = plVar2[3];
        }
        else {
          local_4a0.field_2._M_allocated_capacity = *psVar5;
          local_4a0._M_dataplus._M_p = (pointer)*plVar2;
        }
        local_4a0._M_string_length = plVar2[1];
        *plVar2 = (long)psVar5;
        plVar2[1] = 0;
        *(undefined1 *)(plVar2 + 2) = 0;
        plVar2 = (long *)std::__cxx11::string::append((char *)&local_4a0);
        local_4e8 = &local_4d8;
        puVar4 = (ulong *)(plVar2 + 2);
        if ((ulong *)*plVar2 == puVar4) {
          local_4d8 = *puVar4;
          lStack_4d0 = plVar2[3];
        }
        else {
          local_4d8 = *puVar4;
          local_4e8 = (ulong *)*plVar2;
        }
        local_4e0 = plVar2[1];
        *plVar2 = (long)puVar4;
        plVar2[1] = 0;
        *(undefined1 *)(plVar2 + 2) = 0;
        puVar3 = (undefined8 *)
                 std::__cxx11::string::_M_append
                           ((char *)&local_4e8,(ulong)local_508._M_dataplus._M_p);
        psVar5 = puVar3 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar3 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar5) {
          local_4c0.field_2._M_allocated_capacity = *psVar5;
          local_4c0.field_2._8_8_ = puVar3[3];
          local_4c0._M_dataplus._M_p = (pointer)paVar1;
        }
        else {
          local_4c0.field_2._M_allocated_capacity = *psVar5;
          local_4c0._M_dataplus._M_p = (pointer)*puVar3;
        }
        local_4c0._M_string_length = puVar3[1];
        *puVar3 = psVar5;
        puVar3[1] = 0;
        *(undefined1 *)(puVar3 + 2) = 0;
        plVar2 = (long *)std::__cxx11::string::append((char *)&local_4c0);
        plVar6 = plVar2 + 2;
        if ((long *)*plVar2 == plVar6) {
          local_198 = *plVar6;
          lStack_190 = plVar2[3];
          local_1a8 = &local_198;
        }
        else {
          local_198 = *plVar6;
          local_1a8 = (long *)*plVar2;
        }
        local_1a0 = plVar2[1];
        *plVar2 = (long)plVar6;
        plVar2[1] = 0;
        *(undefined1 *)(plVar2 + 2) = 0;
        std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_1a8);
        if (local_1a8 != &local_198) {
          operator_delete(local_1a8,local_198 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4c0._M_dataplus._M_p != paVar1) {
          operator_delete(local_4c0._M_dataplus._M_p,local_4c0.field_2._M_allocated_capacity + 1);
        }
        if (local_4e8 != &local_4d8) {
          operator_delete(local_4e8,local_4d8 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4a0._M_dataplus._M_p != &local_4a0.field_2) {
          operator_delete(local_4a0._M_dataplus._M_p,local_4a0.field_2._M_allocated_capacity + 1);
        }
        if (local_460 != &local_450) {
          operator_delete(local_460,local_450 + 1);
        }
        if (local_480 != &local_470) {
          operator_delete(local_480,local_470 + 1);
        }
        if (local_438 != &local_428) {
          operator_delete(local_438,local_428 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_410._M_dataplus._M_p != &local_410.field_2) {
          operator_delete(local_410._M_dataplus._M_p,local_410.field_2._M_allocated_capacity + 1);
        }
        if (local_370 != &local_360) {
          operator_delete(local_370,local_360 + 1);
        }
        if (local_390 != &local_380) {
          operator_delete(local_390,local_380 + 1);
        }
        if (local_3b0 != &local_3a0) {
          operator_delete(local_3b0,local_3a0 + 1);
        }
        if (local_3d0 != &local_3c0) {
          operator_delete(local_3d0,local_3c0 + 1);
        }
        if (local_3f0 != &local_3e0) {
          operator_delete(local_3f0,local_3e0 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_350._M_dataplus._M_p != &local_350.field_2) {
          operator_delete(local_350._M_dataplus._M_p,local_350.field_2._M_allocated_capacity + 1);
        }
        if (local_1f0 != &local_1e0) {
          operator_delete(local_1f0,local_1e0 + 1);
        }
        if (local_210 != &local_200) {
          operator_delete(local_210,local_200 + 1);
        }
        if (local_230 != &local_220) {
          operator_delete(local_230,local_220 + 1);
        }
        if (local_250 != &local_240) {
          operator_delete(local_250,local_240 + 1);
        }
        if (local_270 != &local_260) {
          operator_delete(local_270,local_260 + 1);
        }
        if (local_290 != &local_280) {
          operator_delete(local_290,local_280 + 1);
        }
        if (local_2b0 != &local_2a0) {
          operator_delete(local_2b0,local_2a0 + 1);
        }
        if (local_2d0 != &local_2c0) {
          operator_delete(local_2d0,local_2c0 + 1);
        }
        if (local_2f0 != &local_2e0) {
          operator_delete(local_2f0,local_2e0 + 1);
        }
        if (local_310 != &local_300) {
          operator_delete(local_310,local_300 + 1);
        }
        if (local_330 != &local_320) {
          operator_delete(local_330,local_320 + 1);
        }
        uVar8 = local_1c8.field_2._M_allocated_capacity;
        _Var9._M_p = local_1c8._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) goto LAB_006f06d9;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_508._M_dataplus._M_p != &local_508.field_2) {
        operator_delete(local_508._M_dataplus._M_p,local_508.field_2._M_allocated_capacity + 1);
      }
      iVar10 = iVar10 + 1;
    } while (local_4c4 != iVar10);
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

static string lightFragmentTemplate (int numLights, bool isVertexCase, LightType lightType)
{
	string resultTemplate;

	resultTemplate +=
		"#version 300 es\n"
		"layout(location = 0) out mediump vec4 o_color;\n";

	if (!isVertexCase)
	{
		resultTemplate +=
			"uniform mediump vec3 u_material_ambientColor${NAME_SPEC};\n"
			"uniform mediump vec4 u_material_diffuseColor${NAME_SPEC};\n"
			"uniform mediump vec3 u_material_emissiveColor${NAME_SPEC};\n"
			"uniform mediump vec3 u_material_specularColor${NAME_SPEC};\n"
			"uniform mediump float u_material_shininess${NAME_SPEC};\n";

		for (int lightNdx = 0; lightNdx < numLights; lightNdx++)
		{
			string ndxStr = de::toString(lightNdx);

			resultTemplate +=
				"uniform mediump vec3 u_light" + ndxStr + "_color${NAME_SPEC};\n"
				"uniform mediump vec3 u_light" + ndxStr + "_direction${NAME_SPEC};\n";

			if (lightType == LIGHT_POINT)
				resultTemplate +=
					"uniform mediump vec4 u_light" + ndxStr + "_position${NAME_SPEC};\n"
					"uniform mediump float u_light" + ndxStr + "_constantAttenuation${NAME_SPEC};\n"
					"uniform mediump float u_light" + ndxStr + "_linearAttenuation${NAME_SPEC};\n"
					"uniform mediump float u_light" + ndxStr + "_quadraticAttenuation${NAME_SPEC};\n";
		}
	}

	resultTemplate +=
		"uniform sampler2D u_sampler0${NAME_SPEC};\n"
		"in mediump vec4 v_color${NAME_SPEC};\n"
		"in mediump vec2 v_texCoord0${NAME_SPEC};\n";

	if (!isVertexCase)
	{
		resultTemplate +=
			"in mediump vec3 v_eyeNormal${NAME_SPEC};\n";

		if (lightType == LIGHT_POINT)
			resultTemplate +=
				"in mediump vec3 v_directionToLight${NAME_SPEC}[" + de::toString(numLights) + "];\n"
				"in mediump float v_distanceToLight${NAME_SPEC}[" + de::toString(numLights) + "];\n";

		resultTemplate +=
			"mediump vec3 direction (mediump vec4 from, mediump vec4 to)\n"
			"{\n"
			"	return vec3(to.xyz * from.w - from.xyz * to.w);\n"
			"}\n"
			"\n";

		resultTemplate +=
			"mediump vec3 computeLighting (\n"
			"	mediump vec3 directionToLight,\n"
			"	mediump vec3 halfVector,\n"
			"	mediump vec3 normal,\n"
			"	mediump vec3 lightColor,\n"
			"	mediump vec3 diffuseColor,\n"
			"	mediump vec3 specularColor,\n"
			"	mediump float shininess)\n"
			"{\n"
			"	mediump float normalDotDirection  = max(dot(normal, directionToLight), 0.0);\n"
			"	mediump vec3  color               = normalDotDirection * diffuseColor * lightColor;\n"
			"\n"
			"	if (normalDotDirection != 0.0)\n"
			"		color += pow(max(dot(normal, halfVector), 0.0), shininess) * specularColor * lightColor;\n"
			"\n"
			"	return color;\n"
			"}\n"
			"\n";

		if (lightType == LIGHT_POINT)
			resultTemplate +=
				"mediump float computeDistanceAttenuation (mediump float distToLight, mediump float constAtt, mediump float linearAtt, mediump float quadraticAtt)\n"
				"{\n"
				"	return 1.0 / (constAtt + linearAtt * distToLight + quadraticAtt * distToLight * distToLight);\n"
				"}\n"
				"\n";
	}

	resultTemplate +=
		"void main (void)\n"
		"{\n"
		"	mediump vec2 texCoord0 = v_texCoord0${NAME_SPEC}.xy;\n"
		"	mediump vec4 color = v_color${NAME_SPEC};\n";

	if (!isVertexCase)
	{
		resultTemplate +=
			"	mediump vec3 eyeNormal = normalize(v_eyeNormal${NAME_SPEC});\n"
			"\n";

		for (int lightNdx = 0; lightNdx < numLights; lightNdx++)
		{
			string ndxStr = de::toString(lightNdx);

			resultTemplate +=
				"	/* Light " + ndxStr + " */\n";

			if (lightType == LIGHT_POINT)
				resultTemplate +=
					"	mediump vec3 directionToLight" + ndxStr + " = normalize(v_directionToLight${NAME_SPEC}[" + ndxStr + "]);\n"
					"	mediump float distanceToLight" + ndxStr + " = v_distanceToLight${NAME_SPEC}[" + ndxStr + "];\n"
					"	mediump vec3 halfVector" + ndxStr + " = normalize(directionToLight" + ndxStr + " + vec3(0.0, 0.0, 1.0));\n"
					"	color.rgb += computeLighting(directionToLight" + ndxStr + ", halfVector" + ndxStr + ", eyeNormal, u_light" + ndxStr + "_color${NAME_SPEC}, u_material_diffuseColor${NAME_SPEC}.rgb, "
					"u_material_specularColor${NAME_SPEC}, u_material_shininess${NAME_SPEC}) * computeDistanceAttenuation(distanceToLight" + ndxStr + ", u_light" + ndxStr + "_constantAttenuation${NAME_SPEC}, "
					"u_light" + ndxStr + "_linearAttenuation${NAME_SPEC}, u_light" + ndxStr + "_quadraticAttenuation${NAME_SPEC});\n"
					"\n";
			else if (lightType == LIGHT_DIRECTIONAL)
				resultTemplate +=
					"	mediump vec3 directionToLight" + ndxStr + " = -u_light" + ndxStr + "_direction${NAME_SPEC};\n"
					"	mediump vec3 halfVector" + ndxStr + " = normalize(directionToLight" + ndxStr + " + vec3(0.0, 0.0, 1.0));\n"
					"	color.rgb += computeLighting(directionToLight" + ndxStr + ", halfVector" + ndxStr + ", eyeNormal, u_light" + ndxStr + "_color${NAME_SPEC}, u_material_diffuseColor${NAME_SPEC}.rgb, u_material_specularColor${NAME_SPEC}, u_material_shininess${NAME_SPEC});\n"
					"\n";
			else
				DE_ASSERT(DE_FALSE);
		}
	}

	resultTemplate +=
		"	color *= texture(u_sampler0${NAME_SPEC}, texCoord0);\n"
		"	o_color = color + ${FLOAT01};\n"
		"${SEMANTIC_ERROR}"
		"}\n"
		"${INVALID_CHAR}";

	return resultTemplate;
}